

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::LongStressCaseInternal::GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer>::make
          (GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *this,string *name)

{
  Buffer *this_00;
  mapped_type *this_01;
  SharedPtr<deqp::gls::LongStressCaseInternal::Buffer> local_28;
  string *local_18;
  string *name_local;
  GLObjectManager<deqp::gls::LongStressCaseInternal::Buffer> *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  this_00 = (Buffer *)operator_new(8);
  LongStressCaseInternal::Buffer::Buffer(this_00);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>::SharedPtr(&local_28,this_00);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>_>_>_>
            ::operator[](&this->m_objects,local_18);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>::operator=(this_01,&local_28);
  de::SharedPtr<deqp::gls::LongStressCaseInternal::Buffer>::~SharedPtr(&local_28);
  return;
}

Assistant:

void						make						(const string& name)								{ DE_ASSERT(!has(name)); m_objects[name] = SharedPtr<T>(new T); }